

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O0

void __thiscall arith_uint256_tests::bignum_SetCompact::test_method(bignum_SetCompact *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffd538;
  char *in_stack_ffffffffffffd540;
  char *in_stack_ffffffffffffd548;
  undefined7 in_stack_ffffffffffffd550;
  undefined1 in_stack_ffffffffffffd557;
  arith_uint256 *in_stack_ffffffffffffd558;
  const_string *in_stack_ffffffffffffd560;
  const_string *msg;
  arith_uint256 *in_stack_ffffffffffffd568;
  undefined1 *line_num;
  const_string *in_stack_ffffffffffffd570;
  char *file;
  unit_test_log_t *in_stack_ffffffffffffd578;
  unit_test_log_t *this_00;
  bignum_SetCompact *this_local;
  lazy_ostream local_1d39;
  undefined1 local_1d28 [32];
  undefined1 local_1d08 [16];
  const_string local_1cf8;
  lazy_ostream local_1ce1;
  undefined1 local_1cd0 [71];
  lazy_ostream local_1c89;
  undefined1 local_1c78 [71];
  lazy_ostream local_1c31;
  undefined1 local_1c20 [64];
  lazy_ostream local_1be0;
  undefined1 local_1bc8 [64];
  undefined1 local_1b88 [16];
  undefined1 local_1b78 [71];
  lazy_ostream local_1b31;
  undefined1 local_1b20 [71];
  lazy_ostream local_1ad9;
  undefined1 local_1ac8 [64];
  lazy_ostream local_1a88;
  undefined1 local_1a70 [64];
  undefined1 local_1a30 [16];
  undefined1 local_1a20 [71];
  lazy_ostream local_19d9;
  undefined1 local_19c8 [71];
  lazy_ostream local_1981;
  undefined1 local_1970 [64];
  lazy_ostream local_1930;
  undefined1 local_1918 [64];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [71];
  lazy_ostream local_1881;
  undefined1 local_1870 [71];
  lazy_ostream local_1829;
  undefined1 local_1818 [64];
  lazy_ostream local_17d8;
  undefined1 local_17c0 [64];
  undefined1 local_1780 [16];
  undefined1 local_1770 [71];
  lazy_ostream local_1729;
  undefined1 local_1718 [71];
  lazy_ostream local_16d1;
  undefined1 local_16c0 [64];
  lazy_ostream local_1680;
  undefined1 local_1668 [64];
  undefined1 local_1628 [16];
  undefined1 local_1618 [71];
  lazy_ostream local_15d1;
  undefined1 local_15c0 [71];
  lazy_ostream local_1579;
  undefined1 local_1568 [64];
  lazy_ostream local_1528;
  undefined1 local_1510 [64];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [71];
  lazy_ostream local_1479;
  undefined1 local_1468 [71];
  lazy_ostream local_1421;
  undefined1 local_1410 [64];
  lazy_ostream local_13d0;
  undefined1 local_13b8 [64];
  undefined1 local_1378 [16];
  undefined1 local_1368 [64];
  lazy_ostream local_1328;
  undefined1 local_1310 [71];
  lazy_ostream local_12c9;
  undefined1 local_12b8 [71];
  lazy_ostream local_1271;
  undefined1 local_1260 [64];
  lazy_ostream local_1220;
  undefined1 local_1208 [64];
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [71];
  lazy_ostream local_1171;
  undefined1 local_1160 [71];
  lazy_ostream local_1119;
  undefined1 local_1108 [64];
  lazy_ostream local_10c8;
  undefined1 local_10b0 [64];
  undefined1 local_1070 [16];
  undefined1 local_1060 [71];
  lazy_ostream local_1019;
  undefined1 local_1008 [8];
  undefined8 local_1000;
  lazy_ostream local_fc1;
  undefined1 local_fb0 [64];
  lazy_ostream local_f70;
  undefined1 local_f58 [64];
  undefined1 local_f18 [16];
  undefined1 local_f08 [71];
  lazy_ostream local_ec1;
  undefined1 local_eb0 [71];
  lazy_ostream local_e69;
  undefined1 local_e58 [64];
  lazy_ostream local_e18;
  undefined1 local_e00 [64];
  undefined1 local_dc0 [16];
  undefined1 local_db0 [71];
  lazy_ostream local_d69;
  undefined1 local_d58 [71];
  lazy_ostream local_d11;
  undefined1 local_d00 [64];
  lazy_ostream local_cc0;
  undefined1 local_ca8 [64];
  undefined1 local_c68 [16];
  undefined1 local_c58 [71];
  lazy_ostream local_c11;
  undefined1 local_c00 [71];
  lazy_ostream local_bb9;
  undefined1 local_ba8 [64];
  lazy_ostream local_b68;
  undefined1 local_b50 [64];
  undefined1 local_b10 [16];
  undefined1 local_b00 [71];
  lazy_ostream local_ab9;
  undefined1 local_aa8 [71];
  lazy_ostream local_a61;
  undefined1 local_a50 [64];
  lazy_ostream local_a10;
  undefined1 local_9f8 [64];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [71];
  lazy_ostream local_961;
  undefined1 local_950 [71];
  lazy_ostream local_909;
  undefined1 local_8f8 [64];
  lazy_ostream local_8b8;
  undefined1 local_8a0 [64];
  undefined1 local_860 [16];
  undefined1 local_850 [71];
  lazy_ostream local_809;
  undefined1 local_7f8 [71];
  lazy_ostream local_7b1;
  undefined1 local_7a0 [64];
  lazy_ostream local_760;
  undefined1 local_748 [64];
  undefined1 local_708 [16];
  undefined1 local_6f8 [71];
  lazy_ostream local_6b1;
  undefined1 local_6a0 [71];
  lazy_ostream local_659;
  undefined1 local_648 [64];
  lazy_ostream local_608;
  undefined1 local_5f0 [64];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [71];
  lazy_ostream local_559;
  undefined1 local_548 [71];
  lazy_ostream local_501;
  undefined1 local_4f0 [64];
  lazy_ostream local_4b0;
  undefined1 local_498 [64];
  undefined1 local_458 [16];
  undefined1 local_448 [71];
  lazy_ostream local_401;
  undefined1 local_3f0 [71];
  lazy_ostream local_3a9;
  undefined1 local_398 [64];
  lazy_ostream local_358;
  undefined1 local_340 [64];
  undefined1 local_300 [16];
  undefined1 local_2f0 [70];
  bool fOverflow;
  bool fNegative;
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  undefined1 local_208 [32];
  undefined1 local_1e8 [64];
  undefined1 local_1a8 [32];
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  arith_uint256 num;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_ffffffffffffd538);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_2f0,local_300,0x19f,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_358._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_358._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_358;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_340,&local_358.m_empty,0x1a0,1,2,
               (undefined1 *)((long)&local_358._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_3a9._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_3a9;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_398,(undefined1 *)((long)&local_3a9._vptr_lazy_ostream + 1),0x1a1,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_401._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_401;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_3f0,(undefined1 *)((long)&local_401._vptr_lazy_ostream + 1),0x1a2,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_448,local_458,0x1a5,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_4b0._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_4b0._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_4b0;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_498,&local_4b0.m_empty,0x1a6,1,2,
               (undefined1 *)((long)&local_4b0._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_501._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_501;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_4f0,(undefined1 *)((long)&local_501._vptr_lazy_ostream + 1),0x1a7,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_559._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_559;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_548,(undefined1 *)((long)&local_559._vptr_lazy_ostream + 1),0x1a8,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_5a0,local_5b0,0x1ab,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_608._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_608._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_608;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_5f0,&local_608.m_empty,0x1ac,1,2,
               (undefined1 *)((long)&local_608._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_659._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_659;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_648,(undefined1 *)((long)&local_659._vptr_lazy_ostream + 1),0x1ad,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_6b1._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_6b1;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_6a0,(undefined1 *)((long)&local_6b1._vptr_lazy_ostream + 1),0x1ae,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_6f8,local_708,0x1b1,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_760._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_760._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_760;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_748,&local_760.m_empty,0x1b2,1,2,
               (undefined1 *)((long)&local_760._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_7b1._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_7b1;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_7a0,(undefined1 *)((long)&local_7b1._vptr_lazy_ostream + 1),0x1b3,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_809._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_809;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_7f8,(undefined1 *)((long)&local_809._vptr_lazy_ostream + 1),0x1b4,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_850,local_860,0x1b7,1,2,local_c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_8b8._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_8b8._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_8b8;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_8a0,&local_8b8.m_empty,0x1b8,1,2,
               (undefined1 *)((long)&local_8b8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_909._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_909;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_8f8,(undefined1 *)((long)&local_909._vptr_lazy_ostream + 1),0x1b9,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_961._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_961;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_950,(undefined1 *)((long)&local_961._vptr_lazy_ostream + 1),0x1ba,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_9a8,local_9b8,0x1bd,1,2,local_e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_a10._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_a10._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_a10;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_9f8,&local_a10.m_empty,0x1be,1,2,
               (undefined1 *)((long)&local_a10._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_a61._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_a61;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_a50,(undefined1 *)((long)&local_a61._vptr_lazy_ostream + 1),0x1bf,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_ab9._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_ab9;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_aa8,(undefined1 *)((long)&local_ab9._vptr_lazy_ostream + 1),0x1c0,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_b00,local_b10,0x1c3,1,2,local_108);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_b68._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_b68._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_b68;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_b50,&local_b68.m_empty,0x1c4,1,2,
               (undefined1 *)((long)&local_b68._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_bb9._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_bb9;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_ba8,(undefined1 *)((long)&local_bb9._vptr_lazy_ostream + 1),0x1c5,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_c11._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_c11;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_c00,(undefined1 *)((long)&local_c11._vptr_lazy_ostream + 1),0x1c6,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_c58,local_c68,0x1c9,1,2,local_128);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_cc0._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_cc0._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_cc0;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_ca8,&local_cc0.m_empty,0x1ca,1,2,
               (undefined1 *)((long)&local_cc0._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_d11._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_d11;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_d00,(undefined1 *)((long)&local_d11._vptr_lazy_ostream + 1),0x1cb,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_d69._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_d69;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_d58,(undefined1 *)((long)&local_d69._vptr_lazy_ostream + 1),0x1cc,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_db0,local_dc0,0x1cf,1,2,local_148);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_e18._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_e18._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_e18;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_e00,&local_e18.m_empty,0x1d0,1,2,
               (undefined1 *)((long)&local_e18._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_e69._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_e69;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_e58,(undefined1 *)((long)&local_e69._vptr_lazy_ostream + 1),0x1d1,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_ec1._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_ec1;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_eb0,(undefined1 *)((long)&local_ec1._vptr_lazy_ostream + 1),0x1d2,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_f08,local_f18,0x1d5,1,2,local_168);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_f70._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_f70._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_f70;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_f58,&local_f70.m_empty,0x1d6,1,2,
               (undefined1 *)((long)&local_f70._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_fc1._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_fc1;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_fb0,(undefined1 *)((long)&local_fc1._vptr_lazy_ostream + 1),0x1d7,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1019._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1019;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1008,(undefined1 *)((long)&local_1019._vptr_lazy_ostream + 1),0x1d8,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_1060,local_1070,0x1db,1,2,local_188);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_10c8._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_10c8._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffd548 = "0U";
    in_stack_ffffffffffffd540 = (char *)&local_10c8;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_10b0,&local_10c8.m_empty,0x1dc,1,2,
               (undefined1 *)((long)&local_10c8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1119._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1119;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1108,(undefined1 *)((long)&local_1119._vptr_lazy_ostream + 1),0x1dd,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1171._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1171;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1160,(undefined1 *)((long)&local_1171._vptr_lazy_ostream + 1),0x1de,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000000012\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000000012";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_11b8,local_11c8,0x1e1,1,2,local_1a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1220._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_1220._vptr_lazy_ostream._0_4_ = 0x1120000;
    in_stack_ffffffffffffd548 = "0x01120000U";
    in_stack_ffffffffffffd540 = (char *)&local_1220;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1208,&local_1220.m_empty,0x1e2,1,2,
               (undefined1 *)((long)&local_1220._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1271._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1271;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1260,(undefined1 *)((long)&local_1271._vptr_lazy_ostream + 1),0x1e3,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_12c9._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_12c9;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_12b8,(undefined1 *)((long)&local_12c9._vptr_lazy_ostream + 1),0x1e4,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_ffffffffffffd538,0x3e5c1e);
  arith_uint256::operator=
            ((arith_uint256 *)in_stack_ffffffffffffd548,(arith_uint256 *)in_stack_ffffffffffffd540);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1328._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_1328._vptr_lazy_ostream._0_4_ = 0x2008000;
    in_stack_ffffffffffffd548 = "0x02008000U";
    in_stack_ffffffffffffd540 = (char *)&local_1328;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1310,&local_1328.m_empty,0x1e8,1,2,
               (undefined1 *)((long)&local_1328._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"000000000000000000000000000000000000000000000000000000000000007e\"";
    in_stack_ffffffffffffd540 = "000000000000000000000000000000000000000000000000000000000000007e";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_1368,local_1378,0x1eb,1,2,local_1e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_13d0._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_13d0._vptr_lazy_ostream._0_4_ = 0x1fe0000;
    in_stack_ffffffffffffd548 = "0x01fe0000U";
    in_stack_ffffffffffffd540 = (char *)&local_13d0;
    in_stack_ffffffffffffd538 = "num.GetCompact(true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_13b8,&local_13d0.m_empty,0x1ec,1,2,
               (undefined1 *)((long)&local_13d0._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1421._vptr_lazy_ostream._0_1_ = 1;
    in_stack_ffffffffffffd548 = "true";
    in_stack_ffffffffffffd540 = (char *)&local_1421;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1410,(undefined1 *)((long)&local_1421._vptr_lazy_ostream + 1),0x1ed,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1479._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1479;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1468,(undefined1 *)((long)&local_1479._vptr_lazy_ostream + 1),0x1ee,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000001234\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000001234";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_14c0,local_14d0,0x1f1,1,2,local_208);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1528._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_1528._vptr_lazy_ostream._0_4_ = 0x2123400;
    in_stack_ffffffffffffd548 = "0x02123400U";
    in_stack_ffffffffffffd540 = (char *)&local_1528;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1510,&local_1528.m_empty,0x1f2,1,2,
               (undefined1 *)((long)&local_1528._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1579._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1579;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1568,(undefined1 *)((long)&local_1579._vptr_lazy_ostream + 1),499,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_15d1._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_15d1;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_15c0,(undefined1 *)((long)&local_15d1._vptr_lazy_ostream + 1),500,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000000123456\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000000123456";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_1618,local_1628,0x1f7,1,2,local_228);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1680._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_1680._vptr_lazy_ostream._0_4_ = 0x3123456;
    in_stack_ffffffffffffd548 = "0x03123456U";
    in_stack_ffffffffffffd540 = (char *)&local_1680;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1668,&local_1680.m_empty,0x1f8,1,2,
               (undefined1 *)((long)&local_1680._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_16d1._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_16d1;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_16c0,(undefined1 *)((long)&local_16d1._vptr_lazy_ostream + 1),0x1f9,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1729._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1729;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1718,(undefined1 *)((long)&local_1729._vptr_lazy_ostream + 1),0x1fa,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000012345600\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000012345600";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_1770,local_1780,0x1fd,1,2,local_248);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_17d8._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_17d8._vptr_lazy_ostream._0_4_ = 0x4123456;
    in_stack_ffffffffffffd548 = "0x04123456U";
    in_stack_ffffffffffffd540 = (char *)&local_17d8;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_17c0,&local_17d8.m_empty,0x1fe,1,2,
               (undefined1 *)((long)&local_17d8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1829._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1829;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1818,(undefined1 *)((long)&local_1829._vptr_lazy_ostream + 1),0x1ff,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1881._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1881;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1870,(undefined1 *)((long)&local_1881._vptr_lazy_ostream + 1),0x200,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000012345600\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000012345600";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_18c8,local_18d8,0x203,1,2,local_268);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1930._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_1930._vptr_lazy_ostream._0_4_ = 0x4923456;
    in_stack_ffffffffffffd548 = "0x04923456U";
    in_stack_ffffffffffffd540 = (char *)&local_1930;
    in_stack_ffffffffffffd538 = "num.GetCompact(true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1918,&local_1930.m_empty,0x204,1,2,
               (undefined1 *)((long)&local_1930._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1981._vptr_lazy_ostream._0_1_ = 1;
    in_stack_ffffffffffffd548 = "true";
    in_stack_ffffffffffffd540 = (char *)&local_1981;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1970,(undefined1 *)((long)&local_1981._vptr_lazy_ostream + 1),0x205,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_19d9._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_19d9;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_19c8,(undefined1 *)((long)&local_19d9._vptr_lazy_ostream + 1),0x206,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"0000000000000000000000000000000000000000000000000000000092340000\"";
    in_stack_ffffffffffffd540 = "0000000000000000000000000000000000000000000000000000000092340000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_1a20,local_1a30,0x209,1,2,local_288);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1a88._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_1a88._vptr_lazy_ostream._0_4_ = 0x5009234;
    in_stack_ffffffffffffd548 = "0x05009234U";
    in_stack_ffffffffffffd540 = (char *)&local_1a88;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1a70,&local_1a88.m_empty,0x20a,1,2,
               (undefined1 *)((long)&local_1a88._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1ad9._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1ad9;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1ac8,(undefined1 *)((long)&local_1ad9._vptr_lazy_ostream + 1),0x20b,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1b31._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1b31;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1b20,(undefined1 *)((long)&local_1b31._vptr_lazy_ostream + 1),0x20c,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    base_uint<256u>::GetHex_abi_cxx11_
              ((base_uint<256U> *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
    in_stack_ffffffffffffd548 =
         "\"1234560000000000000000000000000000000000000000000000000000000000\"";
    in_stack_ffffffffffffd540 = "1234560000000000000000000000000000000000000000000000000000000000";
    in_stack_ffffffffffffd538 = "num.GetHex()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_1b78,local_1b88,0x20f,1,2,local_2a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd538);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1be0._vptr_lazy_ostream._4_4_ =
         arith_uint256::GetCompact(in_stack_ffffffffffffd558,(bool)in_stack_ffffffffffffd557);
    local_1be0._vptr_lazy_ostream._0_4_ = 0x20123456;
    in_stack_ffffffffffffd548 = "0x20123456U";
    in_stack_ffffffffffffd540 = (char *)&local_1be0;
    in_stack_ffffffffffffd538 = "num.GetCompact()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_1bc8,&local_1be0.m_empty,0x210,1,2,
               (undefined1 *)((long)&local_1be0._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1c31._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1c31;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1c20,(undefined1 *)((long)&local_1c31._vptr_lazy_ostream + 1),0x211,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1c89._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1c89;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1c78,(undefined1 *)((long)&local_1c89._vptr_lazy_ostream + 1),0x212,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  arith_uint256::SetCompact
            (in_stack_ffffffffffffd568,(uint32_t)((ulong)in_stack_ffffffffffffd560 >> 0x20),
             (bool *)in_stack_ffffffffffffd558,
             (bool *)CONCAT17(in_stack_ffffffffffffd557,in_stack_ffffffffffffd550));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffd578,in_stack_ffffffffffffd570,(size_t)in_stack_ffffffffffffd568
               ,in_stack_ffffffffffffd560);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1ce1._vptr_lazy_ostream._0_1_ = 0;
    in_stack_ffffffffffffd548 = "false";
    in_stack_ffffffffffffd540 = (char *)&local_1ce1;
    in_stack_ffffffffffffd538 = "fNegative";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1cd0,(undefined1 *)((long)&local_1ce1._vptr_lazy_ostream + 1),0x215,1,2,
               &fNegative);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    msg = &local_1cf8;
    this_00 = (unit_test_log_t *)0x6c;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    line_num = local_1d08;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd538);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd540,(char (*) [1])in_stack_ffffffffffffd538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd548,in_stack_ffffffffffffd540,
               (unsigned_long)in_stack_ffffffffffffd538);
    local_1d39._vptr_lazy_ostream._0_1_ = 1;
    in_stack_ffffffffffffd548 = "true";
    in_stack_ffffffffffffd540 = (char *)&local_1d39;
    in_stack_ffffffffffffd538 = "fOverflow";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1d28,(undefined1 *)((long)&local_1d39._vptr_lazy_ostream + 1),0x216,1,2,
               &fOverflow);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bignum_SetCompact)
{
    arith_uint256 num;
    bool fNegative;
    bool fOverflow;
    num.SetCompact(0, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x00123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x01003456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x02000056, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x03000000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04000000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x00923456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x01803456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x02800056, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x03800000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04800000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x01123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000012");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x01120000U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    // Make sure that we don't generate compacts with the 0x00800000 bit set
    num = 0x80;
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x02008000U);

    num.SetCompact(0x01fedcba, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "000000000000000000000000000000000000000000000000000000000000007e");
    BOOST_CHECK_EQUAL(num.GetCompact(true), 0x01fe0000U);
    BOOST_CHECK_EQUAL(fNegative, true);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x02123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000001234");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x02123400U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x03123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000123456");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x03123456U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000012345600");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x04123456U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04923456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000012345600");
    BOOST_CHECK_EQUAL(num.GetCompact(true), 0x04923456U);
    BOOST_CHECK_EQUAL(fNegative, true);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x05009234, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000092340000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x05009234U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x20123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "1234560000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x20123456U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0xff123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, true);
}